

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O2

bool __thiscall
snmalloc::
Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_63UL>
::remove_buddy(Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_63UL>
               *this,Contents addr,size_t size)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  K KVar6;
  RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
  *root;
  ulong uVar7;
  RBPath path;
  
  uVar7 = 0x3f;
  if (size - 1 != 0) {
    for (; size - 1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  uVar4 = 0xfffffffffffffff2;
  if (size != 1) {
    uVar4 = (uVar7 ^ 0xffffffffffffffc0) + 0x33;
  }
  if (this->empty_at_or_above <= uVar4) {
    return false;
  }
  uVar7 = size ^ addr;
  lVar5 = -8;
  do {
    if (lVar5 == 0x10) {
      root = &(this->entries)._M_elems[uVar4].tree;
      RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
      ::RBPath::RBPath(&path,(Handle)root);
      bVar3 = RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
              ::find(root,&path,uVar7);
      if (!bVar3) goto LAB_001d6b23;
      if (uVar7 < addr) {
        uVar7 = addr;
      }
      if ((*(byte *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                              ::concretePagemap.body)->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.meta + (uVar7 >> 10 & 0xfffffffffffffff0)) & 1) !=
          0) goto LAB_001d6b23;
      RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
      ::remove_path(root,&path);
      goto LAB_001d6b1f;
    }
    lVar1 = lVar5 + 8;
    lVar2 = lVar5 + 8;
    lVar5 = lVar1;
  } while (uVar7 != *(ulong *)((long)(this->entries)._M_elems[uVar4].cache + lVar2));
  if (uVar7 < addr) {
    uVar7 = addr;
  }
  if ((*(byte *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                          ::concretePagemap.body)->
                        super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                        ).super_MetaEntryBase.meta + (uVar7 >> 10 & 0xfffffffffffffff0)) & 1) == 0)
  {
    KVar6 = RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
            ::remove_min(&(this->entries)._M_elems[uVar4].tree);
    *(K *)((long)(this->entries)._M_elems[uVar4].cache + lVar1) = KVar6;
LAB_001d6b1f:
    bVar3 = true;
  }
  else {
LAB_001d6b23:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline size_t next_pow2_bits(size_t x)
    {
      // Correct for numbers [1..MAX_SIZE].
      if (x == 1)
        return 0;

      return BITS - clz(x - 1);
    }